

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O2

ptr<buffer> __thiscall nuraft::out_of_log_msg::serialize(out_of_log_msg *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint64_t *in_RSI;
  ptr<buffer> pVar1;
  buffer_serializer bs;
  
  buffer::alloc((buffer *)this,9);
  buffer_serializer::buffer_serializer(&bs,(ptr<buffer> *)this,LITTLE);
  buffer_serializer::put_u8(&bs,'\0');
  buffer_serializer::put_u64(&bs,*in_RSI);
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> out_of_log_msg::serialize() const {
    //   << Format >>
    // version                      1 byte
    // start log index of leader    8 bytes
    size_t len = sizeof(uint8_t) + sizeof(ulong);
    ptr<buffer> ret = buffer::alloc(len);

    const uint8_t CURRENT_VERSION = 0x0;
    buffer_serializer bs(ret);
    bs.put_u8(CURRENT_VERSION);
    bs.put_u64(start_idx_of_leader_);
    return ret;
}